

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void pugi::impl::anon_unknown_0::node_output_simple
               (xml_buffered_writer *writer,xml_node_struct *node,uint flags)

{
  char cVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  char_t *pcVar7;
  char_t *pcVar8;
  
  switch((uint)node->header & 0xf) {
  case 3:
    pcVar5 = "";
    if (node->value != (char_t *)0x0) {
      pcVar5 = node->value;
    }
    text_output(writer,pcVar5,ctx_special_pcdata,flags);
    return;
  case 4:
    pcVar5 = "";
    if (node->value != (char_t *)0x0) {
      pcVar5 = node->value;
    }
LAB_00244135:
    xml_buffered_writer::write(writer,0x3c,(void *)0x21,0x5b);
    xml_buffered_writer::write(writer,0x41,(void *)0x54,0x41);
    lVar3 = 0;
    pcVar7 = pcVar5;
    do {
      cVar1 = *pcVar7;
      if (cVar1 == ']') {
        if ((pcVar7[1] == ']') && (pcVar7[2] == '>')) goto LAB_0024419c;
      }
      else if (cVar1 == '\0') goto LAB_0024419c;
      pcVar7 = pcVar7 + 1;
      lVar3 = lVar3 + 1;
    } while( true );
  case 5:
    pcVar7 = "";
    if (node->value != (char *)0x0) {
      pcVar7 = node->value;
    }
    xml_buffered_writer::write(writer,0x3c,(void *)0x21,0x2d);
    cVar1 = *pcVar7;
joined_r0x00243ed0:
    if (cVar1 == '\0') {
      xml_buffered_writer::write(writer,0x2d,(void *)0x2d,0x3e);
      return;
    }
    sVar4 = 0;
    pcVar8 = pcVar7;
    do {
      if (*pcVar8 == '-') {
        if ((pcVar8[1] == '\0') || (pcVar8[1] == '-')) goto LAB_00243f00;
      }
      else if (*pcVar8 == '\0') goto LAB_00243f00;
      pcVar8 = pcVar8 + 1;
      sVar4 = sVar4 + 1;
    } while( true );
  case 6:
    uVar2 = writer->bufsize;
    if (0x7fe < uVar2) {
      xml_buffered_writer::flush(writer,writer->buffer,uVar2);
      writer->bufsize = 0;
      uVar2 = 0;
    }
    (writer->buffer + uVar2)[0] = '<';
    (writer->buffer + uVar2)[1] = '?';
    writer->bufsize = uVar2 + 2;
    pcVar5 = ":anonymous";
    if (node->name != (char_t *)0x0) {
      pcVar5 = node->name;
    }
    xml_buffered_writer::write_string(writer,pcVar5);
    if (node->value != (char_t *)0x0) {
      uVar2 = writer->bufsize;
      if (0x7ff < uVar2) {
        xml_buffered_writer::flush(writer,writer->buffer,uVar2);
        writer->bufsize = 0;
        uVar2 = 0;
      }
      writer->buffer[uVar2] = ' ';
      writer->bufsize = uVar2 + 1;
      pcVar5 = node->value;
      if (*pcVar5 != '\0') {
LAB_00244057:
        sVar4 = 0;
        pcVar7 = pcVar5;
        do {
          if (*pcVar7 == '?') {
            if (pcVar7[1] == '>') goto LAB_00244077;
          }
          else if (*pcVar7 == '\0') goto LAB_00244077;
          pcVar7 = pcVar7 + 1;
          sVar4 = sVar4 + 1;
        } while( true );
      }
    }
    break;
  case 7:
    uVar2 = writer->bufsize;
    if (0x7fe < uVar2) {
      xml_buffered_writer::flush(writer,writer->buffer,uVar2);
      writer->bufsize = 0;
      uVar2 = 0;
    }
    (writer->buffer + uVar2)[0] = '<';
    (writer->buffer + uVar2)[1] = '?';
    writer->bufsize = uVar2 + 2;
    pcVar5 = ":anonymous";
    if (node->name != (char_t *)0x0) {
      pcVar5 = node->name;
    }
    xml_buffered_writer::write_string(writer,pcVar5);
    node_output_attributes(writer,node,"",0,flags | 4,0);
    break;
  case 8:
    xml_buffered_writer::write(writer,0x3c,(void *)0x21,0x44);
    xml_buffered_writer::write(writer,0x54,(void *)0x59,0x50);
    if (node->value != (char_t *)0x0) {
      uVar2 = writer->bufsize;
      if (0x7ff < uVar2) {
        xml_buffered_writer::flush(writer,writer->buffer,uVar2);
        writer->bufsize = 0;
        uVar2 = 0;
      }
      writer->buffer[uVar2] = ' ';
      writer->bufsize = uVar2 + 1;
      xml_buffered_writer::write_string(writer,node->value);
    }
    uVar2 = writer->bufsize;
    if (0x7ff < uVar2) {
      xml_buffered_writer::flush(writer,writer->buffer,uVar2);
      writer->bufsize = 0;
      uVar2 = 0;
    }
    writer->buffer[uVar2] = '>';
    sVar4 = uVar2 + 1;
    goto LAB_002442c2;
  default:
    __assert_fail("false && \"Invalid node type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0x1093,
                  "void pugi::impl::(anonymous namespace)::node_output_simple(xml_buffered_writer &, xml_node_struct *, unsigned int)"
                 );
  }
LAB_002440e9:
  uVar2 = writer->bufsize;
  if (0x7fe < uVar2) {
    xml_buffered_writer::flush(writer,writer->buffer,uVar2);
    writer->bufsize = 0;
    uVar2 = 0;
  }
  (writer->buffer + uVar2)[0] = '?';
  (writer->buffer + uVar2)[1] = '>';
  sVar4 = uVar2 + 2;
LAB_002442c2:
  writer->bufsize = sVar4;
  return;
LAB_00243f00:
  uVar2 = writer->bufsize + sVar4;
  if (uVar2 < 0x801) {
    memcpy(writer->buffer + writer->bufsize,pcVar7,sVar4);
    writer->bufsize = uVar2;
  }
  else {
    xml_buffered_writer::write_direct(writer,pcVar7,sVar4);
  }
  if (*pcVar8 == '-') {
    uVar2 = writer->bufsize;
    if (0x7fe < uVar2) {
      xml_buffered_writer::flush(writer,writer->buffer,uVar2);
      writer->bufsize = 0;
      uVar2 = 0;
    }
    (writer->buffer + uVar2)[0] = '-';
    (writer->buffer + uVar2)[1] = ' ';
    writer->bufsize = uVar2 + 2;
    pcVar8 = pcVar8 + 1;
  }
  else if (*pcVar8 != '\0') {
    __assert_fail("*s == \'-\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0xfdc,
                  "void pugi::impl::(anonymous namespace)::node_output_comment(xml_buffered_writer &, const char_t *)"
                 );
  }
  cVar1 = *pcVar8;
  pcVar7 = pcVar8;
  goto joined_r0x00243ed0;
LAB_0024419c:
  uVar6 = (ulong)((uint)(cVar1 != '\0') * 2);
  sVar4 = lVar3 + uVar6;
  uVar2 = sVar4 + writer->bufsize;
  if (uVar2 < 0x801) {
    memcpy(writer->buffer + writer->bufsize,pcVar5,sVar4);
    writer->bufsize = uVar2;
  }
  else {
    xml_buffered_writer::write_direct(writer,pcVar5,sVar4);
  }
  xml_buffered_writer::write(writer,0x5d,(void *)0x5d,0x3e);
  pcVar5 = pcVar7 + uVar6;
  if (pcVar7[uVar6] == '\0') {
    return;
  }
  goto LAB_00244135;
LAB_00244077:
  uVar2 = writer->bufsize + sVar4;
  if (uVar2 < 0x801) {
    memcpy(writer->buffer + writer->bufsize,pcVar5,sVar4);
    writer->bufsize = uVar2;
  }
  else {
    xml_buffered_writer::write_direct(writer,pcVar5,sVar4);
  }
  if (*pcVar7 == '?') {
    if (pcVar7[1] == '>') {
      xml_buffered_writer::write(writer,0x3f,(void *)0x20,0x3e);
      pcVar7 = pcVar7 + 2;
      goto LAB_002440dc;
    }
  }
  else if (*pcVar7 == '\0') {
LAB_002440dc:
    pcVar5 = pcVar7;
    if (*pcVar7 == '\0') goto LAB_002440e9;
    goto LAB_00244057;
  }
  __assert_fail("s[0] == \'?\' && s[1] == \'>\'",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                ,0xff3,
                "void pugi::impl::(anonymous namespace)::node_output_pi_value(xml_buffered_writer &, const char_t *)"
               );
}

Assistant:

PUGI__FN void node_output_simple(xml_buffered_writer& writer, xml_node_struct* node, unsigned int flags)
	{
		const char_t* default_name = PUGIXML_TEXT(":anonymous");

		switch (PUGI__NODETYPE(node))
		{
			case node_pcdata:
				text_output(writer, node->value ? node->value + 0 : PUGIXML_TEXT(""), ctx_special_pcdata, flags);
				break;

			case node_cdata:
				text_output_cdata(writer, node->value ? node->value + 0 : PUGIXML_TEXT(""));
				break;

			case node_comment:
				node_output_comment(writer, node->value ? node->value + 0 : PUGIXML_TEXT(""));
				break;

			case node_pi:
				writer.write('<', '?');
				writer.write_string(node->name ? node->name + 0 : default_name);

				if (node->value)
				{
					writer.write(' ');
					node_output_pi_value(writer, node->value);
				}

				writer.write('?', '>');
				break;

			case node_declaration:
				writer.write('<', '?');
				writer.write_string(node->name ? node->name + 0 : default_name);
				node_output_attributes(writer, node, PUGIXML_TEXT(""), 0, flags | format_raw, 0);
				writer.write('?', '>');
				break;

			case node_doctype:
				writer.write('<', '!', 'D', 'O', 'C');
				writer.write('T', 'Y', 'P', 'E');

				if (node->value)
				{
					writer.write(' ');
					writer.write_string(node->value);
				}

				writer.write('>');
				break;

			default:
				assert(false && "Invalid node type"); // unreachable
		}
	}